

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
imrt::ApertureILS::getOrderedApertureNeighbors
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  pair<int,_int> pVar7;
  pair<int,_int> pVar8;
  _List_node_base *p_Var9;
  long lVar10;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *ppVar11;
  pointer ppVar12;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *ppVar13;
  pair<int,_int> pVar14;
  ulong uVar15;
  iterator iVar16;
  Station *this_00;
  ulong uVar17;
  _List_node_base *p_Var18;
  long lVar19;
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  a_list;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  pair<bool,_std::pair<imrt::Station_*,_int>_> target_beam;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_a8;
  Station *local_98;
  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
  *local_90;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_88;
  iterator iStack_80;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> *local_78;
  ulong local_70;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_68;
  ulong local_50;
  undefined1 local_48 [8];
  Station *local_40;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list(&local_68,__x);
  (*(this->super_ILS)._vptr_ILS[7])(local_48,this,P);
  uVar4 = 0;
  local_78 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0;
  local_88 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0;
  iStack_80._M_current = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98 = local_40;
  this_00 = local_40;
  local_90 = (vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              *)__return_storage_ptr__;
  if (local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
      _M_size != 0) {
    uVar15 = 0;
    local_70 = 0;
    uVar17 = local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
             _M_node._M_size;
    p_Var18 = local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
              _M_node.super__List_node_base._M_next;
    do {
      p_Var9 = p_Var18[1]._M_next;
      if (*(int *)&p_Var9->_M_prev == this_00->angle) {
        local_70 = uVar15 & 0xffffffff;
      }
      else {
        if (0 < *(int *)&p_Var9[4]._M_next) {
          lVar19 = 0;
          local_50 = uVar15;
          do {
            pVar14 = (pair<int,_int>)(lVar19 << 0x20 | local_50);
            for (lVar10 = 0; iVar5 = Collimator::getXdim((Collimator *)p_Var9[0xb]._M_next),
                lVar10 < iVar5; lVar10 = lVar10 + 1) {
              iVar5 = (int)lVar19;
              pVar8 = Station::getApertureShape((Station *)p_Var18[1]._M_next,iVar5,(int)lVar10);
              pVar7 = Collimator::getActiveRange
                                ((Collimator *)p_Var18[1]._M_next[0xb]._M_next,(int)lVar10,
                                 *(int *)&(p_Var18[1]._M_next)->_M_prev);
              if (pVar7.first != -1) {
                uVar4 = Station::getBeamIndex
                                  ((Station *)p_Var18[1]._M_next,
                                   (pair<int,_int>)(((long)pVar8 << 0x20) + lVar10));
                bVar3 = Station::isOpenBeamlet((Station *)p_Var18[1]._M_next,uVar4,iVar5);
                local_a8.first = pVar14;
                if (bVar3) {
                  local_a8.second = (pair<int,_int>)(((ulong)uVar4 << 0x20) + 0xffffffff);
                  if (iStack_80._M_current == local_78) {
                    std::
                    vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                    ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                              ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                                *)&local_88,iStack_80,&local_a8);
                  }
                  else {
LAB_0012a72f:
                    (iStack_80._M_current)->first = pVar14;
                    (iStack_80._M_current)->second = local_a8.second;
                    iStack_80._M_current = iStack_80._M_current + 1;
                  }
                }
                else {
                  local_a8.second = (pair<int,_int>)((ulong)uVar4 << 0x20 | 1);
                  if (iStack_80._M_current != local_78) goto LAB_0012a72f;
                  std::
                  vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                  ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                            ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                              *)&local_88,iStack_80,&local_a8);
                }
                if (pVar8.first != pVar8.second) {
                  uVar4 = Station::getBeamIndex
                                    ((Station *)p_Var18[1]._M_next,
                                     (pair<int,_int>)(((ulong)pVar8 & 0xffffffff00000000) + lVar10))
                  ;
                  bVar3 = Station::isOpenBeamlet((Station *)p_Var18[1]._M_next,uVar4,iVar5);
                  if (bVar3) {
                    local_a8.second = (pair<int,_int>)((ulong)uVar4 << 0x20 | 0xfffffffe);
                    if (iStack_80._M_current == local_78) {
                      local_a8.first = pVar14;
                      std::
                      vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                      ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                                ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                                  *)&local_88,iStack_80,&local_a8);
                    }
                    else {
LAB_0012a7d4:
                      (iStack_80._M_current)->first = pVar14;
                      (iStack_80._M_current)->second = local_a8.second;
                      iStack_80._M_current = iStack_80._M_current + 1;
                      local_a8.first = pVar14;
                    }
                  }
                  else {
                    local_a8.second = (pair<int,_int>)((ulong)uVar4 << 0x20 | 1);
                    if (iStack_80._M_current != local_78) goto LAB_0012a7d4;
                    local_a8.first = pVar14;
                    std::
                    vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                    ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                              ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                                *)&local_88,iStack_80,&local_a8);
                  }
                }
              }
              p_Var9 = p_Var18[1]._M_next;
            }
            lVar19 = lVar19 + 1;
            p_Var9 = p_Var18[1]._M_next;
            uVar17 = local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                     _M_impl._M_node._M_size;
            uVar15 = local_50;
            this_00 = local_98;
          } while (lVar19 < *(int *)&p_Var9[4]._M_next);
        }
        p_Var18 = p_Var18->_M_next;
      }
      iVar16._M_current = iStack_80._M_current;
      ppVar13 = local_88;
      uVar15 = uVar15 + 1;
    } while (uVar15 < uVar17);
    if ((local_88 != iStack_80._M_current) && (local_88 + 1 != iStack_80._M_current)) {
      lVar19 = 0x10;
      do {
        iVar5 = rand();
        lVar10 = (long)iVar5 % ((lVar19 >> 4) + 1);
        if (lVar19 != lVar10 * 0x10) {
          ppVar11 = ppVar13 + lVar10;
          iVar5 = *(int *)((long)&(ppVar13->first).first + lVar19);
          *(int *)((long)&(ppVar13->first).first + lVar19) = (ppVar11->first).first;
          (ppVar11->first).first = iVar5;
          iVar5 = *(int *)((long)&(ppVar13->first).second + lVar19);
          *(int *)((long)&(ppVar13->first).second + lVar19) = (ppVar11->first).second;
          (ppVar11->first).second = iVar5;
          iVar5 = *(int *)((long)&(ppVar13->second).first + lVar19);
          *(int *)((long)&(ppVar13->second).first + lVar19) = (ppVar11->second).first;
          (ppVar11->second).first = iVar5;
          iVar5 = *(int *)((long)&(ppVar13->second).second + lVar19);
          *(int *)((long)&(ppVar13->second).second + lVar19) = (ppVar11->second).second;
          (ppVar11->second).second = iVar5;
        }
        ppVar11 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                  ((long)&ppVar13[1].first.first + lVar19);
        lVar19 = lVar19 + 0x10;
      } while (ppVar11 != iVar16._M_current);
    }
    uVar4 = (uint)local_70;
  }
  if (0 < this_00->max_apertures) {
    lVar19 = 0;
    do {
      pVar14 = (pair<int,_int>)(lVar19 << 0x20 | (ulong)uVar4);
      for (lVar10 = 0; iVar5 = Collimator::getXdim(this_00->collimator), this_00 = local_98,
          lVar10 < iVar5; lVar10 = lVar10 + 1) {
        pVar8 = Collimator::getActiveRange(local_98->collimator,(int)lVar10,local_98->angle);
        if (pVar8.first != -1) {
          iVar5 = (int)lVar19;
          pVar8 = Station::getApertureShape(this_00,iVar5,(int)lVar10);
          uVar6 = Station::getBeamIndex(this_00,(pair<int,_int>)(((long)pVar8 << 0x20) + lVar10));
          bVar3 = Station::isOpenBeamlet(local_98,uVar6,iVar5);
          local_a8.first = pVar14;
          if (bVar3) {
            local_a8.second = (pair<int,_int>)(((ulong)uVar6 << 0x20) + 0xffffffff);
            iVar16._M_current = *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 8);
            if (iVar16._M_current ==
                *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 0x10)) {
              std::
              vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                        (local_90,iVar16,&local_a8);
            }
            else {
LAB_0012a9a1:
              (iVar16._M_current)->first = pVar14;
              (iVar16._M_current)->second = local_a8.second;
              *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 0x10;
            }
          }
          else {
            local_a8.second = (pair<int,_int>)((ulong)uVar6 << 0x20 | 1);
            iVar16._M_current = *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 8);
            if (iVar16._M_current !=
                *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 0x10))
            goto LAB_0012a9a1;
            std::
            vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
            ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                      (local_90,iVar16,&local_a8);
          }
          this_00 = local_98;
          if (pVar8.first != pVar8.second) {
            uVar6 = Station::getBeamIndex
                              (local_98,(pair<int,_int>)
                                        (((ulong)pVar8 & 0xffffffff00000000) + lVar10));
            bVar3 = Station::isOpenBeamlet(local_98,uVar6,iVar5);
            this_00 = local_98;
            if (bVar3) {
              local_a8.second = (pair<int,_int>)((ulong)uVar6 << 0x20 | 0xfffffffe);
              iVar16._M_current =
                   *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 8);
              if (iVar16._M_current ==
                  *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 0x10)) {
                local_a8.first = pVar14;
                std::
                vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                          (local_90,iVar16,&local_a8);
              }
              else {
LAB_0012aa54:
                (iVar16._M_current)->first = pVar14;
                (iVar16._M_current)->second = local_a8.second;
                *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 0x10;
                local_a8.first = pVar14;
              }
            }
            else {
              local_a8.second = (pair<int,_int>)((ulong)uVar6 << 0x20 | 1);
              iVar16._M_current =
                   *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 8);
              if (iVar16._M_current !=
                  *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 0x10))
              goto LAB_0012aa54;
              local_a8.first = pVar14;
              std::
              vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
              ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                        (local_90,iVar16,&local_a8);
            }
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < local_98->max_apertures);
  }
  ppVar1 = *(pointer *)local_90;
  ppVar2 = *(pointer *)(local_90 + 8);
  if ((ppVar1 != ppVar2) && (ppVar1 + 1 != ppVar2)) {
    lVar19 = 0x10;
    do {
      iVar5 = rand();
      lVar10 = (long)iVar5 % ((lVar19 >> 4) + 1);
      if (lVar19 != lVar10 * 0x10) {
        ppVar12 = ppVar1 + lVar10;
        iVar5 = *(int *)((long)&(ppVar1->first).first + lVar19);
        *(int *)((long)&(ppVar1->first).first + lVar19) = (ppVar12->first).first;
        (ppVar12->first).first = iVar5;
        iVar5 = *(int *)((long)&(ppVar1->first).second + lVar19);
        *(int *)((long)&(ppVar1->first).second + lVar19) = (ppVar12->first).second;
        (ppVar12->first).second = iVar5;
        iVar5 = *(int *)((long)&(ppVar1->second).first + lVar19);
        *(int *)((long)&(ppVar1->second).first + lVar19) = (ppVar12->second).first;
        (ppVar12->second).first = iVar5;
        iVar5 = *(int *)((long)&(ppVar1->second).second + lVar19);
        *(int *)((long)&(ppVar1->second).second + lVar19) = (ppVar12->second).second;
        (ppVar12->second).second = iVar5;
      }
      ppVar12 = (pointer)((long)&ppVar1[1].first.first + lVar19);
      lVar19 = lVar19 + 0x10;
    } while (ppVar12 != ppVar2);
  }
  if (iStack_80._M_current != local_88) {
    lVar19 = 0;
    uVar17 = 0;
    do {
      ppVar13 = (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)
                ((long)&(local_88->first).first + lVar19);
      iVar16._M_current = *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 8);
      if (iVar16._M_current ==
          *(pair<std::pair<int,_int>,_std::pair<int,_int>_> **)(local_90 + 0x10)) {
        std::
        vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
        ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>const&>
                  (local_90,iVar16,ppVar13);
      }
      else {
        pVar14 = ppVar13->second;
        (iVar16._M_current)->first = ppVar13->first;
        (iVar16._M_current)->second = pVar14;
        *(long *)(local_90 + 8) = *(long *)(local_90 + 8) + 0x10;
      }
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 0x10;
    } while (uVar17 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 4));
  }
  if (local_88 != (pair<std::pair<int,_int>,_std::pair<int,_int>_> *)0x0) {
    operator_delete(local_88);
  }
  while (local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_68) {
    p_Var18 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_68.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var18;
  }
  return (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          *)local_90;
}

Assistant:

vector < pair<pair<int, int>, pair<int, int>> > ApertureILS::getOrderedApertureNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  
  pair<bool, pair<Station*, int>> target_beam = getBestLSBeamlet(P);
  Station * target_station = target_beam.second.first;
  int s_target;
  
  vector<pair< pair<int,int> , pair<int, int> >> a_list, final_list;
  list<Station*>::iterator st;
  int beamlet;
  st = stations.begin();
  
  pair <int,int> pattern;
  pair <int,int> active;
  
  for (int s = 0; s < stations.size(); s++) {
    if ((*st)->getAngle() == target_station->getAngle()){
      s_target=s;
      continue;
    }
    for (int a = 0; a < (*st)->getNbApertures(); a++){
      for (int k = 0; k< (*st)->collimator.getXdim() ; k++){
        //One pair -k (-row) for closing aperture
        //One pair (k) (row) for opening aperture
        pattern = (*st)->getApertureShape(a, k);
        active = (*st)->collimator.getActiveRange(k, (*st)->getAngle());
        if (active.first == -1) continue;
        beamlet = (*st)->getBeamIndex(make_pair(k,pattern.first));
        if((*st)->isOpenBeamlet(beamlet, a))
          a_list.push_back(make_pair(make_pair(s,a) , make_pair(-1,beamlet)));
        else 
          a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        
        if (pattern.first != pattern.second) {
          beamlet = (*st)->getBeamIndex(make_pair(k,pattern.second));
          if((*st)->isOpenBeamlet(beamlet, a))
            a_list.push_back(make_pair(make_pair(s,a) , make_pair(-2,beamlet)));
          else 
            a_list.push_back(make_pair(make_pair(s,a) , make_pair( 1,beamlet)));
        }
      }
    }
    std::advance(st,1);
  }
  std::random_shuffle(a_list.begin(), a_list.end());
  
  // Add target station neighbors
  for (int a = 0; a < target_station->getNbApertures(); a++) {
    for (int k = 0; k< target_station->collimator.getXdim() ; k++) {
      active = target_station->collimator.getActiveRange(k, target_station->getAngle());
      if (active.first == -1) continue;
      pattern = target_station->getApertureShape(a, k);
      
      beamlet = target_station->getBeamIndex(make_pair(k,pattern.first));
      if (target_station->isOpenBeamlet(beamlet, a))
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-1,beamlet)));
      else 
        final_list.push_back (make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      
      if (pattern.first != pattern.second) {
        beamlet = target_station->getBeamIndex(make_pair(k,pattern.second));
        if (target_station->isOpenBeamlet(beamlet, a))
          final_list.push_back (make_pair(make_pair(s_target,a) , make_pair(-2,beamlet)));
        else 
          final_list.push_back(make_pair(make_pair(s_target,a) , make_pair( 1,beamlet)));
      }
    }
  }
  std::random_shuffle(final_list.begin(), final_list.end());
  for (int i=0; i<a_list.size(); i++) {
    final_list.push_back(a_list[i]);
  }
  
  return(final_list);
}